

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O1

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  _Rb_tree_header *p_Var1;
  unsigned_long_long *this_00;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var2;
  char cVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr *pp_Var6;
  size_t *psVar7;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  char *__function;
  PseudoOptWithIntSelType *in_RDX;
  void *__child_stack;
  void *__child_stack_00;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> _Var10;
  void *in_R8;
  Up containedDt;
  _tPseudoDtSels selLocPseudoDtsPair;
  undefined8 local_170;
  undefined1 local_168 [8];
  __uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> local_160;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> local_158;
  undefined1 local_150 [8];
  _Rb_tree_node_base local_148;
  _Rb_tree_node_base *local_128;
  undefined1 local_11c [4];
  undefined1 local_118 [8];
  undefined8 local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Rb_tree_node_base *p_Stack_f8;
  _Base_ptr local_f0;
  _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
  local_e8;
  undefined1 local_b8 [48];
  _tPseudoDtSels local_88;
  
  if (*(int *)((pseudoDt->_loc)._lineNumber + 8) != 2) {
    __assert_fail("_pseudoTraceType->majorVersion() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x3ef,
                  "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt &)"
                 );
  }
  local_108._M_allocated_capacity = 0x6c616e6f6974706f;
  local_110 = (__node_base_ptr)0x8;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_118 = (undefined1  [8])&local_108;
  _pseudoDtIntSels<yactfr::internal::PseudoOptWithIntSelType>
            ((_tPseudoDtSels *)(local_b8 + 0x30),(DtFromPseudoRootDtConverter *)pseudoDt,in_RDX,
             (string *)local_118);
  if (local_118 != (undefined1  [8])&local_108) {
    operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
  }
  this_00 = &(pseudoDt->_posInScope).super_type.m_storage;
  pmVar4 = std::__detail::
           _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)local_118);
  *pmVar4 = 0;
  _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_168,pseudoDt);
  local_118 = (undefined1  [8])in_RDX;
  std::
  _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this_00);
  if (local_88.second._M_h._M_element_count == 0) {
    __assert_fail("!pseudoSelDts.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x3fa,
                  "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt &)"
                 );
  }
  local_158._M_head_impl = (DataType *)this;
  cVar3 = (*(code *)(local_88.second._M_h._M_before_begin._M_nxt[1]._M_nxt)->_M_nxt[7]._M_nxt)();
  if (cVar3 == '\0') {
    local_110 = (__node_base_ptr)((ulong)local_110._4_4_ << 0x20);
    local_108._M_allocated_capacity = 0;
    local_f0 = (_Rb_tree_node_base *)0x0;
    p_Var5 = (in_RDX->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(in_RDX->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header;
    local_108._8_8_ = (_Rb_tree_node_base *)&local_110;
    p_Stack_f8 = (_Rb_tree_node_base *)&local_110;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        local_150 = *(undefined1 (*) [8])(p_Var5 + 1);
        local_148._0_8_ = p_Var5[1]._M_parent;
        if ((long)local_148._0_8_ < (long)local_150) {
          __function = 
          "yactfr::IntegerRange<long long>::IntegerRange(const ValueT, const ValueT) [ValueT = long long, ValidatePreconditionsV = true]"
          ;
          goto LAB_001f92e4;
        }
        std::
        _Rb_tree<yactfr::IntegerRange<long_long,true>,yactfr::IntegerRange<long_long,true>,std::_Identity<yactfr::IntegerRange<long_long,true>>,std::less<yactfr::IntegerRange<long_long,true>>,std::allocator<yactfr::IntegerRange<long_long,true>>>
        ::_M_insert_unique<yactfr::IntegerRange<long_long,true>>
                  ((_Rb_tree<yactfr::IntegerRange<long_long,true>,yactfr::IntegerRange<long_long,true>,std::_Identity<yactfr::IntegerRange<long_long,true>>,std::less<yactfr::IntegerRange<long_long,true>>,std::allocator<yactfr::IntegerRange<long_long,true>>>
                    *)local_118,(IntegerRange<long_long,_true> *)local_150);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    _Var10._M_head_impl = local_158._M_head_impl;
    local_11c = (undefined1  [4])0x1;
    p_Var5 = &local_e8._M_impl.super__Rb_tree_header._M_header;
    if (local_108._M_allocated_capacity == 0) {
      psVar7 = &local_e8._M_impl.super__Rb_tree_header._M_node_count;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var5;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_right = p_Var5;
    }
    else {
      psVar7 = (size_t *)&local_f0;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_color = local_110._0_4_;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)local_108._M_allocated_capacity;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_108._8_8_;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_f8;
      *(_Base_ptr *)(local_108._M_allocated_capacity + 8) = p_Var5;
      local_e8._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_f0;
      local_108._M_allocated_capacity = 0;
      p_Var5 = local_f0;
      local_108._8_8_ = (_Rb_tree_node_base *)&local_110;
      p_Stack_f8 = (_Rb_tree_node_base *)&local_110;
    }
    iVar8 = (int)p_Var5;
    *psVar7 = 0;
    std::
    _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
    ::_Rb_tree((_Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
                *)local_150,&local_e8);
    _Var2._M_head_impl =
         (in_RDX->super_PseudoOptType).super_WithAttrsMixin._attrs._M_t.
         super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
         _M_t.
         super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
         .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
    if (_Var2._M_head_impl == (MapItem *)0x0) {
      local_160._M_t.
      super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
      .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl =
           (tuple<const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>)
           (_Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
           )0x0;
    }
    else {
      MapItem::clone((MapItem *)local_b8,(__fn *)_Var2._M_head_impl,__child_stack_00,iVar8,in_R8);
      local_160._M_t.
      super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
      .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl =
           (tuple<const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>)
           (tuple<const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>)
           local_b8._0_8_;
      local_b8._0_8_ =
           (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
           0x0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_b8);
    }
    std::
    make_unique<yactfr::OptionalWithSignedIntegerSelectorType_const,int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,yactfr::IntegerRangeSet<long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
              ((int *)&local_170,
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               local_11c,(DataLocation *)local_168,
               (IntegerRangeSet<long_long,_true> *)(local_b8 + 0x30),
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_150);
    (_Var10._M_head_impl)->_vptr_DataType = local_170;
    local_170 = 0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_160);
    std::
    _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
    ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
                 *)local_150);
    std::
    _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
    ::~_Rb_tree(&local_e8);
    std::
    _Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
    ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<long_long,_true>,_yactfr::IntegerRange<long_long,_true>,_std::_Identity<yactfr::IntegerRange<long_long,_true>_>,_std::less<yactfr::IntegerRange<long_long,_true>_>,_std::allocator<yactfr::IntegerRange<long_long,_true>_>_>
                 *)local_118);
  }
  else {
    local_160._M_t.
    super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>.
    super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl._0_4_ = PacketContext;
    local_110 = (__node_base_ptr)((ulong)local_110._4_4_ << 0x20);
    local_108._M_allocated_capacity = 0;
    local_f0 = (_Rb_tree_node_base *)0x0;
    p_Var5 = (in_RDX->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(in_RDX->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header;
    local_108._8_8_ = (_Rb_tree_node_base *)&local_110;
    p_Stack_f8 = (_Rb_tree_node_base *)&local_110;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        local_150 = *(undefined1 (*) [8])(p_Var5 + 1);
        local_148._0_8_ = p_Var5[1]._M_parent;
        if ((ulong)local_148._0_8_ < (ulong)local_150) {
          __function = 
          "yactfr::IntegerRange<unsigned long long>::IntegerRange(const ValueT, const ValueT) [ValueT = unsigned long long, ValidatePreconditionsV = true]"
          ;
LAB_001f92e4:
          __assert_fail("lower <= upper",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/include/yactfr/metadata/int-range.hpp"
                        ,0x38,__function);
        }
        std::
        _Rb_tree<yactfr::IntegerRange<unsigned_long_long,true>,yactfr::IntegerRange<unsigned_long_long,true>,std::_Identity<yactfr::IntegerRange<unsigned_long_long,true>>,std::less<yactfr::IntegerRange<unsigned_long_long,true>>,std::allocator<yactfr::IntegerRange<unsigned_long_long,true>>>
        ::_M_insert_unique<yactfr::IntegerRange<unsigned_long_long,true>>
                  ((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,true>,yactfr::IntegerRange<unsigned_long_long,true>,std::_Identity<yactfr::IntegerRange<unsigned_long_long,true>>,std::less<yactfr::IntegerRange<unsigned_long_long,true>>,std::allocator<yactfr::IntegerRange<unsigned_long_long,true>>>
                    *)local_118,(IntegerRange<unsigned_long_long,_true> *)local_150);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    _Var10._M_head_impl = local_158._M_head_impl;
    p_Var9 = &local_148;
    if (local_108._M_allocated_capacity == 0) {
      pp_Var6 = &local_128;
      local_148._0_8_ = (ulong)(uint)local_148._4_4_ << 0x20;
      local_148._M_parent = (_Base_ptr)0x0;
      local_148._M_left = p_Var9;
      local_148._M_right = p_Var9;
    }
    else {
      pp_Var6 = &local_f0;
      local_148._M_color = local_110._0_4_;
      local_148._M_parent = (_Base_ptr)local_108._M_allocated_capacity;
      local_148._M_left = (_Base_ptr)local_108._8_8_;
      local_148._M_right = p_Stack_f8;
      *(_Rb_tree_node_base **)(local_108._M_allocated_capacity + 8) = p_Var9;
      local_128 = local_f0;
      local_108._M_allocated_capacity = 0;
      p_Var9 = local_f0;
      local_108._8_8_ = (_Rb_tree_node_base *)&local_110;
      p_Stack_f8 = (_Rb_tree_node_base *)&local_110;
    }
    iVar8 = (int)p_Var9;
    *pp_Var6 = (_Base_ptr)0x0;
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                *)local_b8,
               (_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                *)local_150);
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                 *)local_150);
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                 *)local_118);
    _Var2._M_head_impl =
         (in_RDX->super_PseudoOptType).super_WithAttrsMixin._attrs._M_t.
         super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
         _M_t.
         super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
         .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
    if (_Var2._M_head_impl == (MapItem *)0x0) {
      local_150 = (undefined1  [8])0x0;
    }
    else {
      MapItem::clone((MapItem *)local_118,(__fn *)_Var2._M_head_impl,__child_stack,iVar8,in_R8);
      local_150 = local_118;
      local_118 = (undefined1  [8])0x0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_118);
    }
    std::
    make_unique<yactfr::OptionalWithUnsignedIntegerSelectorType_const,int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
              ((int *)&local_170,
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               &local_160,(DataLocation *)local_168,
               (IntegerRangeSet<unsigned_long_long,_true> *)(local_b8 + 0x30),
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_b8);
    (_Var10._M_head_impl)->_vptr_DataType = local_170;
    local_170 = 0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_150);
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                 *)local_b8);
  }
  if ((_Head_base<0UL,_const_yactfr::StructureType_*,_false>)local_168 !=
      (_Head_base<0UL,_const_yactfr::StructureType_*,_false>)0x0) {
    (*(((CompoundDataType *)local_168)->super_DataType)._vptr_DataType[1])();
  }
  std::
  _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_88.second._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88.first._pathElems);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(tuple<const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>)
           _Var10._M_head_impl;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoOptWithIntSelType(const PseudoDt& pseudoDt)
{
    assert(_pseudoTraceType->majorVersion() == 2);

    auto& pseudoOptType = static_cast<const PseudoOptWithIntSelType&>(pseudoDt);
    auto selLocPseudoDtsPair = this->_pseudoDtIntSels(pseudoOptType, "optional");
    auto& selLoc = selLocPseudoDtsPair.first;
    const auto& pseudoSelDts = selLocPseudoDtsPair.second;

    auto containedDt = this->_whileVisitingPseudoDt(pseudoOptType, [this](auto& pseudoOptType) {
        return this->_dtFromPseudoDt(pseudoOptType.pseudoDt());
    });

    assert(!pseudoSelDts.empty());

    if ((*pseudoSelDts.begin())->isUInt()) {
        return OptionalWithUnsignedIntegerSelectorType::create(1, std::move(containedDt),
                                                               std::move(selLoc),
                                                               uIntRangeSetFromUIntRangeSetWithoutPrecondsCheck(pseudoOptType.selRanges()),
                                                               tryCloneAttrs(pseudoOptType.attrs()));
    } else {
        using SInt = long long;

        std::set<IntegerRange<SInt>> ranges;

        for (auto& range : pseudoOptType.selRanges()) {
            ranges.insert(IntegerRange<SInt> {
                static_cast<SInt>(range.lower()),
                static_cast<SInt>(range.upper())
            });
        }

        return OptionalWithSignedIntegerSelectorType::create(1, std::move(containedDt),
                                                             std::move(selLoc),
                                                             IntegerRangeSet<SInt> {std::move(ranges)},
                                                             tryCloneAttrs(pseudoOptType.attrs()));
    }

    return nullptr;
}